

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logreplay.c
# Opt level: O0

void nh_view_replay_finish(void)

{
  replay_restore_windowprocs();
  program_state.viewing = 0;
  program_state.game_running = 0;
  replay_end();
  freedynamicdata();
  free_checkpoints();
  logfile = -1;
  iflags.disable_log = '\0';
  return;
}

Assistant:

void nh_view_replay_finish(void)
{
    replay_restore_windowprocs();
    program_state.viewing = FALSE;
    program_state.game_running = FALSE;
    replay_end();
    freedynamicdata();
    free_checkpoints();
    logfile = -1;
    iflags.disable_log = FALSE;
}